

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
                   (Options *options,FieldDescriptor *field)

{
  float fVar1;
  bool bVar2;
  CppType CVar3;
  int iVar4;
  string *macro_prefix;
  long lVar5;
  char *pcVar6;
  SubstituteArg *arg1;
  FieldDescriptor *in_RDX;
  string *in_RDI;
  float fVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  float value_1;
  double value;
  string *float_value;
  LogMessage *in_stack_fffffffffffffb08;
  Options *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  LogMessage *in_stack_fffffffffffffb20;
  string *in_stack_fffffffffffffb38;
  allocator *paVar11;
  AlphaNum *in_stack_fffffffffffffb48;
  SubstituteArg *in_stack_fffffffffffffb58;
  float value_00;
  undefined4 in_stack_fffffffffffffb60;
  double in_stack_fffffffffffffb68;
  SubstituteArg *arg0;
  char *in_stack_fffffffffffffb78;
  string *in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffbac;
  SubstituteArg *in_stack_fffffffffffffbb0;
  SubstituteArg *in_stack_fffffffffffffbb8;
  SubstituteArg *in_stack_fffffffffffffbc0;
  SubstituteArg *in_stack_fffffffffffffbc8;
  SubstituteArg *in_stack_fffffffffffffbd0;
  SubstituteArg *in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbf0;
  undefined1 qualified;
  EnumDescriptor *in_stack_fffffffffffffbf8;
  allocator local_3da [58];
  string local_3a0 [32];
  string local_380 [16];
  int64 in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  SubstituteArg local_300;
  SubstituteArg local_2d0;
  SubstituteArg local_2a0;
  SubstituteArg local_270;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  string local_180 [80];
  SubstituteArg local_130;
  allocator local_dd;
  undefined1 local_dc;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  float local_d8;
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  double local_d0;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [96];
  string local_38 [32];
  FieldDescriptor *local_18;
  
  qualified = (undefined1)((ulong)in_stack_fffffffffffffbf0 >> 0x38);
  local_18 = in_RDX;
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4341df);
  switch(CVar3) {
  case CPPTYPE_INT32:
    FieldDescriptor::default_value_int32(local_18);
    Int32ToString_abi_cxx11_(in_stack_fffffffffffffbac);
    break;
  case CPPTYPE_INT64:
    paVar11 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"PROTOBUF",paVar11);
    FieldDescriptor::default_value_int64(local_18);
    Int64ToString(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    break;
  case CPPTYPE_UINT32:
    FieldDescriptor::default_value_uint32(local_18);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)in_stack_fffffffffffffb10,
               (uint)((ulong)in_stack_fffffffffffffb08 >> 0x20));
    StrCat_abi_cxx11_(in_stack_fffffffffffffb48);
    std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
    std::__cxx11::string::~string(local_38);
    break;
  case CPPTYPE_UINT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"PROTOBUF",&local_c1);
    macro_prefix = (string *)FieldDescriptor::default_value_uint64(local_18);
    UInt64ToString(macro_prefix,(uint64)in_stack_fffffffffffffbd0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    break;
  case CPPTYPE_DOUBLE:
    dVar9 = FieldDescriptor::default_value_double(local_18);
    local_d0 = dVar9;
    dVar10 = std::numeric_limits<double>::infinity();
    if ((dVar9 != dVar10) || (NAN(dVar9) || NAN(dVar10))) {
      dVar9 = local_d0;
      dVar10 = std::numeric_limits<double>::infinity();
      if ((dVar9 != -dVar10) || (NAN(dVar9) || NAN(-dVar10))) {
        if (NAN(local_d0)) {
          paVar11 = &local_d3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)in_RDI,"std::numeric_limits<double>::quiet_NaN()",paVar11);
          std::allocator<char>::~allocator((allocator<char> *)&local_d3);
        }
        else {
          SimpleDtoa_abi_cxx11_(in_stack_fffffffffffffb68);
        }
      }
      else {
        paVar11 = &local_d2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)in_RDI,"-std::numeric_limits<double>::infinity()",paVar11);
        std::allocator<char>::~allocator((allocator<char> *)&local_d2);
      }
    }
    else {
      paVar11 = &local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)in_RDI,"std::numeric_limits<double>::infinity()",paVar11);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    break;
  case CPPTYPE_FLOAT:
    fVar7 = FieldDescriptor::default_value_float(local_18);
    value_00 = (float)((ulong)in_stack_fffffffffffffb58 >> 0x20);
    local_d8 = fVar7;
    fVar8 = std::numeric_limits<float>::infinity();
    fVar1 = local_d8;
    if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
      fVar7 = std::numeric_limits<float>::infinity();
      if ((fVar1 != -fVar7) || (NAN(fVar1) || NAN(-fVar7))) {
        if (NAN(local_d8)) {
          paVar11 = &local_db;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)in_RDI,"std::numeric_limits<float>::quiet_NaN()",paVar11);
          std::allocator<char>::~allocator((allocator<char> *)&local_db);
        }
        else {
          local_dc = 0;
          SimpleFtoa_abi_cxx11_(value_00);
          lVar5 = std::__cxx11::string::find_first_of((char *)in_RDI,0x7632c3);
          if (lVar5 != -1) {
            std::__cxx11::string::push_back((char)in_RDI);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)in_RDI,"-std::numeric_limits<float>::infinity()",&local_da);
        std::allocator<char>::~allocator((allocator<char> *)&local_da);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)in_RDI,"std::numeric_limits<float>::infinity()",&local_d9);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    break;
  case CPPTYPE_BOOL:
    bVar2 = FieldDescriptor::default_value_bool(local_18);
    pcVar6 = "false";
    if (bVar2) {
      pcVar6 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar6,&local_dd);
    std::allocator<char>::~allocator((allocator<char> *)&local_dd);
    break;
  case CPPTYPE_ENUM:
    FieldDescriptor::enum_type((FieldDescriptor *)in_stack_fffffffffffffb10);
    arg0 = &local_130;
    ClassName_abi_cxx11_(in_stack_fffffffffffffbf8,(bool)qualified);
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)in_stack_fffffffffffffb10,(string *)in_stack_fffffffffffffb08);
    arg1 = (SubstituteArg *)
           FieldDescriptor::default_value_enum((FieldDescriptor *)in_stack_fffffffffffffb10);
    iVar4 = EnumValueDescriptor::number((EnumValueDescriptor *)arg1);
    Int32ToString_abi_cxx11_(in_stack_fffffffffffffbac);
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)in_stack_fffffffffffffb10,(string *)in_stack_fffffffffffffb08);
    strings::internal::SubstituteArg::SubstituteArg(&local_1b0);
    strings::internal::SubstituteArg::SubstituteArg(&local_1e0);
    strings::internal::SubstituteArg::SubstituteArg(&local_210);
    strings::internal::SubstituteArg::SubstituteArg(&local_240);
    strings::internal::SubstituteArg::SubstituteArg(&local_270);
    strings::internal::SubstituteArg::SubstituteArg(&local_2a0);
    strings::internal::SubstituteArg::SubstituteArg(&local_2d0);
    strings::internal::SubstituteArg::SubstituteArg(&local_300);
    strings::Substitute_abi_cxx11_
              (in_stack_fffffffffffffb78,arg0,arg1,
               (SubstituteArg *)CONCAT44(iVar4,in_stack_fffffffffffffb60),in_stack_fffffffffffffb58,
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbc0,
               in_stack_fffffffffffffbc8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbd8);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string((string *)&local_130);
    break;
  case CPPTYPE_STRING:
    FieldDescriptor::default_value_string_abi_cxx11_(local_18);
    CEscape(in_stack_fffffffffffffb38);
    EscapeTrigraphs(in_stack_fffffffffffffb88);
    std::operator+((char *)in_stack_fffffffffffffb18,&in_stack_fffffffffffffb10->dllexport_decl);
    std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string(local_340);
    std::__cxx11::string::~string(local_360);
    break;
  case CPPTYPE_MESSAGE:
    FieldMessageTypeName_abi_cxx11_
              ((FieldDescriptor *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
    std::operator+((char *)in_stack_fffffffffffffb18,&in_stack_fffffffffffffb10->dllexport_decl);
    std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
    std::__cxx11::string::~string(local_380);
    std::__cxx11::string::~string(local_3a0);
    break;
  default:
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffb20,(LogLevel)((ulong)in_stack_fffffffffffffb18 >> 0x20),
               (char *)in_stack_fffffffffffffb10,(int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
    internal::LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    internal::LogMessage::~LogMessage((LogMessage *)0x434d65);
    paVar11 = local_3da;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",paVar11);
    std::allocator<char>::~allocator((allocator<char> *)local_3da);
  }
  return in_RDI;
}

Assistant:

std::string DefaultValue(const Options& options, const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return Int32ToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return StrCat(field->default_value_uint32()) + "u";
    case FieldDescriptor::CPPTYPE_INT64:
      return Int64ToString("PROTOBUF", field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return UInt64ToString("PROTOBUF", field->default_value_uint64());
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "std::numeric_limits<double>::infinity()";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "-std::numeric_limits<double>::infinity()";
      } else if (value != value) {
        return "std::numeric_limits<double>::quiet_NaN()";
      } else {
        return SimpleDtoa(value);
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "std::numeric_limits<float>::infinity()";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "-std::numeric_limits<float>::infinity()";
      } else if (value != value) {
        return "std::numeric_limits<float>::quiet_NaN()";
      } else {
        std::string float_value = SimpleFtoa(value);
        // If floating point value contains a period (.) or an exponent
        // (either E or e), then append suffix 'f' to make it a float
        // literal.
        if (float_value.find_first_of(".eE") != string::npos) {
          float_value.push_back('f');
        }
        return float_value;
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      // Lazy:  Generate a static_cast because we don't have a helper function
      //   that constructs the full name of an enum value.
      return strings::Substitute(
          "static_cast< $0 >($1)", ClassName(field->enum_type(), true),
          Int32ToString(field->default_value_enum()->number()));
    case FieldDescriptor::CPPTYPE_STRING:
      return "\"" +
             EscapeTrigraphs(CEscape(field->default_value_string())) +
             "\"";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "*" + FieldMessageTypeName(field, options) +
             "::internal_default_instance()";
  }
  // Can't actually get here; make compiler happy.  (We could add a default
  // case above but then we wouldn't get the nice compiler warning when a
  // new type is added.)
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}